

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_ring_lines(rf_vec2 center,float inner_radius,float outer_radius,int start_angle,
                       int end_angle,int segments,rf_color color)

{
  _Bool _Var1;
  uint uVar2;
  uchar w;
  uchar z;
  int iVar3;
  ulong uVar4;
  uchar x;
  int v_count;
  int end_angle_00;
  bool bVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float __x;
  float local_98;
  uchar local_88;
  float local_78;
  float fStack_74;
  
  if (start_angle == end_angle) {
    return;
  }
  fVar9 = (float)(~-(uint)(outer_radius < inner_radius) & (uint)outer_radius |
                 (~-(uint)(0.0 < inner_radius) & 0x3dcccccd |
                 -(uint)(0.0 < inner_radius) & (uint)inner_radius) &
                 -(uint)(outer_radius < inner_radius));
  end_angle_00 = start_angle;
  if (start_angle < end_angle) {
    end_angle_00 = end_angle;
  }
  if (inner_radius <= outer_radius) {
    outer_radius = inner_radius;
  }
  if (end_angle < start_angle) {
    start_angle = end_angle;
  }
  if (segments < 4) {
    fVar6 = -0.5 / fVar9 + 1.0;
    fVar6 = fVar6 * fVar6;
    fVar6 = acosf(fVar6 + fVar6 + -1.0);
    fVar6 = ceilf(6.2831855 / fVar6);
    uVar2 = (uint)((fVar6 * (float)(end_angle_00 - start_angle)) / 360.0);
    segments = 4;
    if (0 < (int)uVar2) {
      segments = uVar2;
    }
  }
  if (outer_radius <= 0.0) {
    rf_draw_circle_sector_lines(center,fVar9,start_angle,end_angle_00,segments,color);
    return;
  }
  iVar3 = (end_angle_00 - start_angle) % 0x168;
  v_count = segments * 4 + 4;
  if (iVar3 == 0) {
    v_count = segments * 4;
  }
  _Var1 = rf_gfx_check_buffer_limit(v_count);
  if (_Var1) {
    rf_gfx_draw();
  }
  local_98 = (float)start_angle;
  rf_gfx_begin(RF_LINES);
  local_88 = color.g;
  w = color.a;
  z = color.b;
  x = color.r;
  fStack_74 = center.y;
  local_78 = center.x;
  if (iVar3 != 0) {
    rf_gfx_color4ub(x,local_88,z,w);
    fVar6 = local_98 * 0.017453292;
    fVar7 = sinf(fVar6);
    fVar8 = cosf(fVar6);
    rf_gfx_vertex2f(fVar7 * fVar9 + local_78,fVar8 * fVar9 + fStack_74);
    fVar7 = sinf(fVar6);
    fVar6 = cosf(fVar6);
    rf_gfx_vertex2f(fVar7 * outer_radius + local_78,fStack_74 + fVar6 * outer_radius);
  }
  uVar4 = 0;
  if (0 < segments) {
    uVar4 = (ulong)(uint)segments;
  }
  while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
    rf_gfx_color4ub(x,local_88,z,w);
    __x = local_98 * 0.017453292;
    fVar6 = sinf(__x);
    fVar7 = cosf(__x);
    rf_gfx_vertex2f(fVar6 * fVar9 + local_78,fVar7 * fVar9 + fStack_74);
    local_98 = local_98 + (float)(end_angle_00 - start_angle) / (float)segments;
    fVar6 = local_98 * 0.017453292;
    fVar7 = sinf(fVar6);
    fVar8 = cosf(fVar6);
    rf_gfx_vertex2f(fVar7 * fVar9 + local_78,fVar8 * fVar9 + fStack_74);
    fVar7 = sinf(__x);
    fVar8 = cosf(__x);
    rf_gfx_vertex2f(fVar7 * outer_radius + local_78,fVar8 * outer_radius + fStack_74);
    fVar7 = sinf(fVar6);
    fVar6 = cosf(fVar6);
    rf_gfx_vertex2f(fVar7 * outer_radius + local_78,fVar6 * outer_radius + fStack_74);
  }
  if (iVar3 != 0) {
    rf_gfx_color4ub(x,local_88,z,w);
    local_98 = local_98 * 0.017453292;
    fVar6 = sinf(local_98);
    fVar7 = cosf(local_98);
    rf_gfx_vertex2f(fVar6 * fVar9 + local_78,fVar9 * fVar7 + fStack_74);
    fVar9 = sinf(local_98);
    fVar6 = cosf(local_98);
    rf_gfx_vertex2f(fVar9 * outer_radius + local_78,outer_radius * fVar6 + fStack_74);
  }
  rf_gfx_end();
  return;
}

Assistant:

RF_API void rf_draw_ring_lines(rf_vec2 center, float inner_radius, float outer_radius, int start_angle, int end_angle, int segments, rf_color color)
{
    if (start_angle == end_angle) return;

    // Function expects (outerRadius > innerRadius)
    if (outer_radius < inner_radius)
    {
        float tmp = outer_radius;
        outer_radius = inner_radius;
        inner_radius = tmp;

        if (outer_radius <= 0.0f) outer_radius = 0.1f;
    }

    // Function expects (endAngle > start_angle)
    if (end_angle < start_angle)
    {
        // Swap values
        int tmp = start_angle;
        start_angle = end_angle;
        end_angle = tmp;
    }

    if (segments < 4)
    {
        // Calculate how many segments we need to draw a smooth circle, taken from https://stackoverflow.com/a/2244088

        float CIRCLE_ERROR_RATE = 0.5f;

        // Calculate the maximum angle between segments based on the error rate.
        float th = acosf(2*powf(1 - CIRCLE_ERROR_RATE/outer_radius, 2) - 1);
        segments = (end_angle - start_angle) * ceilf(2 * RF_PI / th) / 360;

        if (segments <= 0) segments = 4;
    }

    if (inner_radius <= 0.0f)
    {
        rf_draw_circle_sector_lines(center, outer_radius, start_angle, end_angle, segments, color);
        return;
    }

    float step_length = (float)(end_angle - start_angle)/(float)segments;
    float angle = start_angle;

    bool show_cap_lines = true;
    int limit = 4 * (segments + 1);
    if ((end_angle - start_angle)%360 == 0) { limit = 4 * segments; show_cap_lines = false; }

    if (rf_gfx_check_buffer_limit(limit)) rf_gfx_draw();

    rf_gfx_begin(RF_LINES);
    if (show_cap_lines)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*outer_radius, center.y + cosf(RF_DEG2RAD*angle)*outer_radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*inner_radius, center.y + cosf(RF_DEG2RAD*angle)*inner_radius);
    }

    for (rf_int i = 0; i < segments; i++)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*outer_radius, center.y + cosf(RF_DEG2RAD*angle)*outer_radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*outer_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*outer_radius);

        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*inner_radius, center.y + cosf(RF_DEG2RAD*angle)*inner_radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*inner_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*inner_radius);

        angle += step_length;
    }

    if (show_cap_lines)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*outer_radius, center.y + cosf(RF_DEG2RAD*angle)*outer_radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*inner_radius, center.y + cosf(RF_DEG2RAD*angle)*inner_radius);
    }
    rf_gfx_end();
}